

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O1

void Rnm_ManStop(Rnm_Man_t *p,int fProfile)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Vec_Str_t *__ptr;
  Vec_Int_t *pVVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  int level;
  double dVar10;
  double dVar11;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  
  if (p != (Rnm_Man_t *)0x0) {
    if ((fProfile != 0) && (p->nCalls != 0)) {
      lVar9 = (long)p->pGia->nTravIdsAlloc * 4 + (long)p->pGia->nObjsAlloc * 0xc + 1000;
      lVar1 = ((long)p->vObjs->nCap + (long)p->nObjsAlloc) * 4 + 0x80;
      lVar2 = p->timeTotal;
      lVar3 = p->timeFwd;
      lVar4 = p->timeBwd;
      lVar5 = p->timeVer;
      level = 0x9fee97;
      puts("Abstraction refinement runtime statistics:");
      Abc_Print(level,"%s =","Sensetization");
      dVar10 = 0.0;
      if (p->timeTotal != 0) {
        dVar10 = ((double)p->timeFwd * 100.0) / (double)p->timeTotal;
      }
      local_58._0_4_ = (undefined4)lVar9;
      local_58._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      uStack_50._0_4_ = local_58._4_4_;
      local_58 = (double)CONCAT44(0x43300000,(undefined4)local_58);
      uStack_50._4_4_ = 0x45300000;
      local_68._0_4_ = (undefined4)lVar1;
      local_68._4_4_ = (undefined4)((ulong)lVar1 >> 0x20);
      uStack_60._0_4_ = local_68._4_4_;
      local_68 = (double)CONCAT44(0x43300000,(undefined4)local_68);
      uStack_60._4_4_ = 0x45300000;
      Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeFwd / 1000000.0,dVar10);
      Abc_Print(level,"%s =","Justification");
      dVar10 = 0.0;
      if (p->timeTotal != 0) {
        dVar10 = ((double)p->timeBwd * 100.0) / (double)p->timeTotal;
      }
      auVar7._8_4_ = SUB84(uStack_50 - 1.9342813113834067e+25,0);
      auVar7._0_8_ = local_58 - 4503599627370496.0;
      auVar7._12_4_ = (int)((ulong)(uStack_50 - 1.9342813113834067e+25) >> 0x20);
      auVar8._8_4_ = SUB84(uStack_60 - 1.9342813113834067e+25,0);
      auVar8._0_8_ = local_68 - 4503599627370496.0;
      auVar8._12_4_ = (int)((ulong)(uStack_60 - 1.9342813113834067e+25) >> 0x20);
      Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeBwd / 1000000.0,dVar10);
      Abc_Print(level,"%s =","Verification ");
      dVar10 = 0.0;
      if (p->timeTotal != 0) {
        dVar10 = ((double)p->timeVer * 100.0) / (double)p->timeTotal;
      }
      Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeVer / 1000000.0,dVar10);
      Abc_Print(level,"%s =","Other        ");
      dVar10 = (double)(lVar2 - (lVar3 + lVar4 + lVar5));
      dVar11 = 0.0;
      if (p->timeTotal != 0) {
        dVar11 = (dVar10 * 100.0) / (double)p->timeTotal;
      }
      Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar10 / 1000000.0,dVar11);
      Abc_Print(level,"%s =","TOTAL        ");
      dVar11 = (double)p->timeTotal;
      dVar10 = 0.0;
      if (p->timeTotal != 0) {
        dVar10 = (dVar11 * 100.0) / dVar11;
      }
      Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar11 / 1000000.0,dVar10);
      printf("Total calls = %d.  Average refine = %.1f. GIA mem = %.3f MB.  Other mem = %.3f MB.\n",
             (double)p->nRefines / (double)p->nCalls,
             (auVar7._8_8_ + (local_58 - 4503599627370496.0)) * 9.5367431640625e-07,
             SUB84((auVar8._8_8_ + (local_68 - 4503599627370496.0)) * 9.5367431640625e-07,0));
    }
    Gia_ManCleanMark0(p->pGia);
    Gia_ManCleanMark1(p->pGia);
    Gia_ManStaticFanoutStop(p->pGia);
    __ptr = p->vCounts;
    if (__ptr->pArray != (char *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (char *)0x0;
    }
    if (__ptr != (Vec_Str_t *)0x0) {
      free(__ptr);
    }
    pVVar6 = p->vFanins;
    if (pVVar6->pArray != (int *)0x0) {
      free(pVVar6->pArray);
      pVVar6->pArray = (int *)0x0;
    }
    if (pVVar6 != (Vec_Int_t *)0x0) {
      free(pVVar6);
    }
    pVVar6 = p->vObjs;
    if (pVVar6->pArray != (int *)0x0) {
      free(pVVar6->pArray);
      pVVar6->pArray = (int *)0x0;
    }
    if (pVVar6 != (Vec_Int_t *)0x0) {
      free(pVVar6);
    }
    if (p->pObjs != (Rnm_Obj_t *)0x0) {
      free(p->pObjs);
      p->pObjs = (Rnm_Obj_t *)0x0;
    }
    free(p);
    return;
  }
  return;
}

Assistant:

void Rnm_ManStop( Rnm_Man_t * p, int fProfile )
{
    if ( !p ) return;
    // print runtime statistics
    if ( fProfile && p->nCalls )
    {
        double MemGia = sizeof(Gia_Man_t) + sizeof(Gia_Obj_t) * p->pGia->nObjsAlloc + sizeof(int) * p->pGia->nTravIdsAlloc;
        double MemOther = sizeof(Rnm_Man_t) + sizeof(Rnm_Obj_t) * p->nObjsAlloc + sizeof(int) * Vec_IntCap(p->vObjs);
        abctime timeOther = p->timeTotal - p->timeFwd - p->timeBwd - p->timeVer;
        printf( "Abstraction refinement runtime statistics:\n" );
        ABC_PRTP( "Sensetization", p->timeFwd,   p->timeTotal );
        ABC_PRTP( "Justification", p->timeBwd,   p->timeTotal );
        ABC_PRTP( "Verification ", p->timeVer,   p->timeTotal );
        ABC_PRTP( "Other        ", timeOther,    p->timeTotal );
        ABC_PRTP( "TOTAL        ", p->timeTotal, p->timeTotal );
        printf( "Total calls = %d.  Average refine = %.1f. GIA mem = %.3f MB.  Other mem = %.3f MB.\n", 
            p->nCalls, 1.0*p->nRefines/p->nCalls, MemGia/(1<<20), MemOther/(1<<20) );
    }

    Gia_ManCleanMark0(p->pGia);
    Gia_ManCleanMark1(p->pGia);
    Gia_ManStaticFanoutStop(p->pGia);
//    Gia_ManSetPhase(p->pGia);
//    Vec_IntFree( p->vIsopMem );
//    Vec_IntFree( p->vSatVars );
//    Vec_IntFree( p->vSat2Ids );
    Vec_StrFree( p->vCounts );
    Vec_IntFree( p->vFanins );
    Vec_IntFree( p->vObjs );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}